

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgDConstructGridGlobal.hpp
# Opt level: O2

void TasGrid::writeNodeDataList<false>
               (forward_list<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_> *data,
               ostream *os)

{
  long lVar1;
  long lVar2;
  NodeData *x;
  vector<const_TasGrid::NodeData_*,_std::allocator<const_TasGrid::NodeData_*>_> *__range2;
  pointer ppNVar3;
  vector<const_TasGrid::NodeData_*,_std::allocator<const_TasGrid::NodeData_*>_> data_refs;
  _Vector_base<const_TasGrid::NodeData_*,_std::allocator<const_TasGrid::NodeData_*>_> local_38;
  
  lVar1 = *(long *)os;
  lVar2 = *(long *)(lVar1 + -0x18);
  *(uint *)(os + lVar2 + 0x18) = *(uint *)(os + lVar2 + 0x18) & 0xfffffefb | 0x100;
  *(undefined8 *)(os + *(long *)(lVar1 + -0x18) + 8) = 0x11;
  makeReverseReferenceVector<TasGrid::NodeData>
            ((vector<const_TasGrid::NodeData_*,_std::allocator<const_TasGrid::NodeData_*>_> *)
             &local_38,data);
  IO::writeNumbers<false,(TasGrid::IO::IOPad)3,int>
            (os,(int)((ulong)((long)local_38._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_38._M_impl.super__Vector_impl_data._M_start) >> 3));
  for (ppNVar3 = local_38._M_impl.super__Vector_impl_data._M_start;
      ppNVar3 != local_38._M_impl.super__Vector_impl_data._M_finish; ppNVar3 = ppNVar3 + 1) {
    x = *ppNVar3;
    IO::writeVector<false,(TasGrid::IO::IOPad)1,int>(&x->point,os);
    IO::writeVector<false,(TasGrid::IO::IOPad)3,double>(&x->value,os);
  }
  ::std::_Vector_base<const_TasGrid::NodeData_*,_std::allocator<const_TasGrid::NodeData_*>_>::
  ~_Vector_base(&local_38);
  return;
}

Assistant:

void writeNodeDataList(const std::forward_list<NodeData> &data, std::ostream &os){
    if (use_ascii == mode_ascii){ os << std::scientific; os.precision(17); }

    auto data_refs = makeReverseReferenceVector(data);

    IO::writeNumbers<use_ascii, IO::pad_line>(os, static_cast<int>(data_refs.size()));
    for(auto d : data_refs){
        IO::writeVector<use_ascii, IO::pad_rspace>(d->point, os);
        IO::writeVector<use_ascii, IO::pad_line>(d->value, os);
    }
}